

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void opengv::absolute_pose::modules::upnp_main_sym
               (Matrix<double,_10,_10,_0,_10,_10> *M,Matrix<double,_1,_10,_1,_1,_10> *C,double gamma
               ,vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                *quaternions)

{
  bool bVar1;
  Scalar *pSVar2;
  Scalar *pSVar3;
  pointer ppVar4;
  size_type sVar5;
  pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *in_RDX;
  double in_XMM0_Qa;
  double dVar6;
  Product<Eigen::Transpose<Eigen::Matrix<double,_10,_1,_0,_10,_1>_>,_Eigen::Matrix<double,_10,_10,_0,_10,_10>,_0>
  PVar7;
  iterator qidx;
  double value;
  Matrix<double,_1,_1,_0,_1,_1> valueM;
  Matrix<double,_10,_1,_0,_10,_1> s;
  int q_1;
  int q;
  double norm;
  Vector4d quaternion;
  int i;
  vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  bad_quaternions;
  Matrix<std::complex<double>,_8,_8,_0,_8,_8> V;
  EigenSolver<Eigen::Matrix<double,_8,_8,_0,_8,_8>_> Eig;
  Matrix<double,_8,_8,_0,_8,_8> Action;
  Matrix<double,_8,_8,_0,_8,_8> *in_stack_00008508;
  double in_stack_00008510;
  Matrix<double,_1,_10,_1,_1,_10> *in_stack_00008518;
  Matrix<double,_10,_10,_0,_10,_10> *in_stack_00008520;
  value_type *in_stack_ffffffffffffea80;
  iterator in_stack_ffffffffffffea88;
  const_iterator in_stack_ffffffffffffea90;
  undefined7 in_stack_ffffffffffffea98;
  undefined1 in_stack_ffffffffffffea9f;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_10,_1,_1,_10>_>,_const_Eigen::Matrix<double,_1,_10,_1,_1,_10>_>_>
  *in_stack_ffffffffffffeaa0;
  StorageBaseType *in_stack_ffffffffffffeac8;
  Scalar *in_stack_ffffffffffffead0;
  undefined8 in_stack_ffffffffffffead8;
  undefined1 computeEigenvectors;
  EigenBase<Eigen::Matrix<double,_8,_8,_0,_8,_8>_> *in_stack_ffffffffffffeae0;
  EigenSolver<Eigen::Matrix<double,_8,_8,_0,_8,_8>_> *in_stack_ffffffffffffeae8;
  Matrix<double,_10,_1,_0,_10,_1> *in_stack_ffffffffffffeb20;
  Vector4d *in_stack_ffffffffffffeb28;
  __normal_iterator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_*,_std::vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  local_1468;
  double local_1460;
  undefined8 local_1458;
  non_const_type local_13f8;
  Product<Eigen::Transpose<Eigen::Matrix<double,_10,_1,_0,_10,_1>_>,_Eigen::Matrix<double,_10,_10,_0,_10,_10>,_0>
  local_13f0;
  EigenSolver<Eigen::Matrix<double,_8,_8,_0,_8,_8>_> *in_stack_ffffffffffffec20;
  int local_1320;
  int local_131c;
  double local_1318;
  int local_12dc;
  
  computeEigenvectors = (undefined1)((ulong)in_stack_ffffffffffffead8 >> 0x38);
  Eigen::Matrix<double,_8,_8,_0,_8,_8>::Matrix((Matrix<double,_8,_8,_0,_8,_8> *)0x7fdebd);
  upnp::setupAction_sym_gj(in_stack_00008520,in_stack_00008518,in_stack_00008510,in_stack_00008508);
  Eigen::EigenSolver<Eigen::Matrix<double,8,8,0,8,8>>::EigenSolver<Eigen::Matrix<double,8,8,0,8,8>>
            (in_stack_ffffffffffffeae8,in_stack_ffffffffffffeae0,(bool)computeEigenvectors);
  Eigen::EigenSolver<Eigen::Matrix<double,_8,_8,_0,_8,_8>_>::eigenvectors(in_stack_ffffffffffffec20)
  ;
  std::
  vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ::vector((vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
            *)0x7fdf1f);
  for (local_12dc = 0; local_12dc < 8; local_12dc = local_12dc + 1) {
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)0x7fdf45);
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_8,_8,_0,_8,_8>,_1>::
             operator()((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_8,_8,_0,_8,_8>,_1> *)
                        in_stack_ffffffffffffea88._M_current,(Index)in_stack_ffffffffffffea80,
                        0x7fdf61);
    in_stack_ffffffffffffeb28 = (Vector4d *)std::complex<double>::real_abi_cxx11_(pSVar2);
    in_stack_ffffffffffffeb20 =
         (Matrix<double,_10,_1,_0,_10,_1> *)
         Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                   ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)
                    in_stack_ffffffffffffea88._M_current,(Index)in_stack_ffffffffffffea80);
    (in_stack_ffffffffffffeb20->super_PlainObjectBase<Eigen::Matrix<double,_10,_1,_0,_10,_1>_>).
    m_storage.m_data.array[0] = (double)in_stack_ffffffffffffeb28;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_8,_8,_0,_8,_8>,_1>::
             operator()((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_8,_8,_0,_8,_8>,_1> *)
                        in_stack_ffffffffffffea88._M_current,(Index)in_stack_ffffffffffffea80,
                        0x7fdfce);
    dVar6 = std::complex<double>::real_abi_cxx11_(pSVar2);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)
                        in_stack_ffffffffffffea88._M_current,(Index)in_stack_ffffffffffffea80);
    *pSVar3 = dVar6;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_8,_8,_0,_8,_8>,_1>::
             operator()((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_8,_8,_0,_8,_8>,_1> *)
                        in_stack_ffffffffffffea88._M_current,(Index)in_stack_ffffffffffffea80,
                        0x7fe03b);
    dVar6 = std::complex<double>::real_abi_cxx11_(pSVar2);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)
                        in_stack_ffffffffffffea88._M_current,(Index)in_stack_ffffffffffffea80);
    *pSVar3 = dVar6;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_8,_8,_0,_8,_8>,_1>::
             operator()((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_8,_8,_0,_8,_8>,_1> *)
                        in_stack_ffffffffffffea88._M_current,(Index)in_stack_ffffffffffffea80,
                        0x7fe09c);
    dVar6 = std::complex<double>::real_abi_cxx11_(pSVar2);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)
                        in_stack_ffffffffffffea88._M_current,(Index)in_stack_ffffffffffffea80);
    *pSVar3 = dVar6;
    local_1318 = 0.0;
    for (local_131c = 0; local_131c < 4; local_131c = local_131c + 1) {
      in_stack_ffffffffffffead0 =
           Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)
                      in_stack_ffffffffffffea88._M_current,(Index)in_stack_ffffffffffffea80);
      dVar6 = pow(*in_stack_ffffffffffffead0,2.0);
      local_1318 = dVar6 + local_1318;
    }
    dVar6 = sqrt(local_1318);
    for (local_1320 = 0; local_1320 < 4; local_1320 = local_1320 + 1) {
      in_stack_ffffffffffffeac8 =
           (StorageBaseType *)
           Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)
                      in_stack_ffffffffffffea88._M_current,(Index)in_stack_ffffffffffffea80);
      *(double *)in_stack_ffffffffffffeac8 = *(double *)in_stack_ffffffffffffeac8 / dVar6;
    }
    Eigen::Matrix<double,_10,_1,_0,_10,_1>::Matrix((Matrix<double,_10,_1,_0,_10,_1> *)0x7fe209);
    upnp_fill_s(in_stack_ffffffffffffeb28,in_stack_ffffffffffffeb20);
    local_13f8 = (non_const_type)
                 Eigen::DenseBase<Eigen::Matrix<double,_10,_1,_0,_10,_1>_>::transpose
                           ((DenseBase<Eigen::Matrix<double,_10,_1,_0,_10,_1>_> *)
                            in_stack_ffffffffffffea80);
    PVar7 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,10,1,0,10,1>>>::operator*
                      ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_10,_1,_0,_10,_1>_>_> *)
                       in_stack_ffffffffffffea88._M_current,
                       (MatrixBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_> *)
                       in_stack_ffffffffffffea80);
    local_13f0 = PVar7;
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,10,1,0,10,1>>,Eigen::Matrix<double,10,10,0,10,10>,0>>
    ::operator*((MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_10,_1,_0,_10,_1>_>,_Eigen::Matrix<double,_10,_10,_0,_10,_10>,_0>_>
                 *)CONCAT17(in_stack_ffffffffffffea9f,in_stack_ffffffffffffea98),
                (MatrixBase<Eigen::Matrix<double,_10,_1,_0,_10,_1>_> *)
                in_stack_ffffffffffffea90._M_current);
    local_1458 = 0x4000000000000000;
    Eigen::operator*(in_stack_ffffffffffffead0,in_stack_ffffffffffffeac8);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,10,1,1,10>const>const,Eigen::Matrix<double,1,10,1,1,10>const>>
    ::operator*(in_stack_ffffffffffffeaa0,
                (MatrixBase<Eigen::Matrix<double,_10,_1,_0,_10,_1>_> *)
                CONCAT17(in_stack_ffffffffffffea9f,in_stack_ffffffffffffea98));
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,10,1,0,10,1>>,Eigen::Matrix<double,10,10,0,10,10>,0>,Eigen::Matrix<double,10,1,0,10,1>,0>>
    ::operator+((MatrixBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_10,_1,_0,_10,_1>_>,_Eigen::Matrix<double,_10,_10,_0,_10,_10>,_0>,_Eigen::Matrix<double,_10,_1,_0,_10,_1>,_0>_>
                 *)PVar7.m_lhs.m_matrix.m_matrix,
                (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_10,_1,_1,_10>_>,_const_Eigen::Matrix<double,_1,_10,_1,_1,_10>_>,_Eigen::Matrix<double,_10,_1,_0,_10,_1>,_0>_>
                 *)PVar7.m_rhs);
    Eigen::Matrix<double,1,1,0,1,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,10,1,0,10,1>>,Eigen::Matrix<double,10,10,0,10,10>,0>,Eigen::Matrix<double,10,1,0,10,1>,0>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,10,1,1,10>const>const,Eigen::Matrix<double,1,10,1,1,10>const>,Eigen::Matrix<double,10,1,0,10,1>,0>const>>
              ((Matrix<double,_1,_1,_0,_1,_1> *)in_stack_ffffffffffffea88._M_current,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_10,_1,_0,_10,_1>_>,_Eigen::Matrix<double,_10,_10,_0,_10,_10>,_0>,_Eigen::Matrix<double,_10,_1,_0,_10,_1>,_0>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_10,_1,_1,_10>_>,_const_Eigen::Matrix<double,_1,_10,_1,_1,_10>_>,_Eigen::Matrix<double,_10,_1,_0,_10,_1>,_0>_>_>
                *)in_stack_ffffffffffffea80);
    in_stack_ffffffffffffeaa0 =
         (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_10,_1,_1,_10>_>,_const_Eigen::Matrix<double,_1,_10,_1,_1,_10>_>_>
          *)Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_1>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_1> *)
                       in_stack_ffffffffffffea88._M_current,(Index)in_stack_ffffffffffffea80);
    local_1460 = *(double *)in_stack_ffffffffffffeaa0 + in_XMM0_Qa;
    local_1468._M_current =
         (pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
         std::
         vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
         ::begin((vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                  *)in_stack_ffffffffffffea80);
    while( true ) {
      std::
      vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
      ::end((vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
             *)in_stack_ffffffffffffea80);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_*,_std::vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                          *)in_stack_ffffffffffffea88._M_current,
                         (__normal_iterator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_*,_std::vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                          *)in_stack_ffffffffffffea80);
      in_stack_ffffffffffffea9f = false;
      if (bVar1) {
        ppVar4 = __gnu_cxx::
                 __normal_iterator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_*,_std::vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                 ::operator->(&local_1468);
        in_stack_ffffffffffffea9f = ppVar4->first < local_1460;
      }
      if ((bool)in_stack_ffffffffffffea9f == false) break;
      __gnu_cxx::
      __normal_iterator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_*,_std::vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
      ::operator++((__normal_iterator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_*,_std::vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                    *)in_stack_ffffffffffffea90._M_current,
                   (int)((ulong)in_stack_ffffffffffffea88._M_current >> 0x20));
    }
    in_stack_ffffffffffffea90._M_current = in_RDX;
    __gnu_cxx::
    __normal_iterator<std::pair<double,Eigen::Matrix<double,4,1,0,4,1>>const*,std::vector<std::pair<double,Eigen::Matrix<double,4,1,0,4,1>>,Eigen::aligned_allocator<std::pair<double,Eigen::Matrix<double,4,1,0,4,1>>>>>
    ::__normal_iterator<std::pair<double,Eigen::Matrix<double,4,1,0,4,1>>*>
              ((__normal_iterator<const_std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_*,_std::vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                *)in_stack_ffffffffffffea88._M_current,
               (__normal_iterator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_*,_std::vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                *)in_stack_ffffffffffffea80);
    std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::
    pair<double_&,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_&,_true>
              (in_stack_ffffffffffffea88._M_current,&in_stack_ffffffffffffea80->first,
               (Matrix<double,_4,_1,_0,_4,_1> *)0x7fe42e);
    in_stack_ffffffffffffea88 =
         std::
         vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
         ::insert(in_stack_ffffffffffffea88._M_current,in_stack_ffffffffffffea90,
                  in_stack_ffffffffffffea80);
  }
  sVar5 = std::
          vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
          ::size((vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                  *)in_RDX);
  if (sVar5 == 0) {
    std::
    vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
    ::operator=((vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                 *)in_stack_ffffffffffffeb28,
                (vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                 *)in_stack_ffffffffffffeb20);
  }
  std::
  vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ::~vector((vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
             *)CONCAT17(in_stack_ffffffffffffea9f,in_stack_ffffffffffffea98));
  return;
}

Assistant:

void
opengv::absolute_pose::modules::upnp_main_sym(
    const Eigen::Matrix<double,10,10> & M,
    const Eigen::Matrix<double,1,10> & C,
    double gamma,
    std::vector<std::pair<double,Eigen::Vector4d>,Eigen::aligned_allocator< std::pair<double,Eigen::Vector4d> > > & quaternions )
{
  Eigen::Matrix<double,8,8> Action;
  upnp::setupAction_sym_gj( M, C, gamma, Action );
  Eigen::EigenSolver< Eigen::Matrix<double,8,8> > Eig( Action, true );
  Eigen::Matrix<std::complex<double>,8,8> V = Eig.eigenvectors();
  
  //ok, let's cut the imaginary solutions (with a reasonable threshold!)
  // const double imagThreshold = 0.01;
  std::vector<std::pair<double,Eigen::Vector4d>,Eigen::aligned_allocator< std::pair<double,Eigen::Vector4d> > > bad_quaternions;
  
  for( int i = 0; i < 8; i++ )
  {
    Eigen::Vector4d quaternion;
    quaternion[3] = V(7,i).real();
    quaternion[2] = V(6,i).real();
    quaternion[1] = V(5,i).real();
    quaternion[0] = V(4,i).real();
    
    double norm = 0.0;
    for( int q = 0; q < 4; q++ )
      norm += pow(quaternion[q],2.0);
    norm = sqrt(norm);
    for( int q = 0; q < 4; q++ )
      quaternion[q] /= norm;
    
    Eigen::Matrix<double,10,1> s;
    upnp_fill_s(quaternion,s);
    Eigen::Matrix<double,1,1> valueM = s.transpose() * M * s + 2.0 * C * s;
    double value = valueM[0] + gamma;

    if( true )//fabs(D[i].imag()) < imagThreshold ) //use all results for the moment
    {
      std::vector<std::pair<double,Eigen::Vector4d>,Eigen::aligned_allocator< std::pair<double,Eigen::Vector4d> > >::iterator
          qidx = quaternions.begin();
      while( qidx != quaternions.end() && qidx->first < value )
        qidx++;
      
      quaternions.insert(qidx,std::pair<double,Eigen::Vector4d>(value,quaternion));
    }
    else
    {
      std::vector<std::pair<double,Eigen::Vector4d>,Eigen::aligned_allocator< std::pair<double,Eigen::Vector4d> > >::iterator
          qidx = bad_quaternions.begin();
      while( qidx != bad_quaternions.end() && qidx->first < value )
        qidx++;
      
      bad_quaternions.insert(qidx,std::pair<double,Eigen::Vector4d>(value,quaternion));
    }
  }
  if( quaternions.size() == 0 )
    quaternions = bad_quaternions;
}